

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

gs_val_t * gs_c_fn_sin(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  float fVar1;
  gs_val_type signature_arg_types [1];
  gs_val_t sig;
  gs_val_type local_34;
  gs_val_t local_30;
  
  local_34 = GS_VAL_FLOAT;
  gs_c_fn_signature(&local_30,eval,vals,num_vals,&local_34,1);
  if (local_30.is_return == true) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_30.field_2._8_8_;
    __return_storage_ptr__->type = local_30.type;
    __return_storage_ptr__->is_return = (_Bool)local_30.is_return;
    *(int3 *)&__return_storage_ptr__->field_0x5 = local_30._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_30.field_2.vec2_val;
  }
  else {
    fVar1 = sinf((vals->field_2).float_val);
    __return_storage_ptr__->type = GS_VAL_FLOAT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).float_val = fVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_sin(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_FLOAT };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);;
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    return gs_val_float(sinf(vals[0].float_val));
}